

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O3

AEStackFrame __thiscall moira::Moira::makeFrame<96ul>(Moira *this,u32 addr)

{
  ushort uVar1;
  u32 uVar2;
  u16 uVar3;
  AEStackFrame AVar4;
  
  uVar2 = (this->reg).pc;
  uVar3 = getSR(this,&(this->reg).sr);
  uVar1 = (this->queue).ird;
  this->fcl = '\x01';
  AVar4.pc = uVar2 + 2;
  AVar4.sr = uVar3;
  AVar4.ird = uVar1;
  AVar4._0_8_ = (ulong)(uVar1 & 0xffffffe0) + (ulong)(this->reg).sr.s * 4 + ((ulong)addr << 0x20) +
                0x11;
  return AVar4;
}

Assistant:

AEStackFrame
Moira::makeFrame(u32 addr)
{
    return makeFrame <F> (addr, getPC(), getSR(), getIRD());
}